

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_ternary_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *restype,uint32_t select,
          uint32_t true_value,uint32_t false_value)

{
  SPIRType *pSVar1;
  uint index;
  anon_class_8_1_8991fb9c swiz;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pSVar1 = Compiler::expression_type(&this->super_Compiler,select);
  if (pSVar1->vecsize == 1) {
    to_enclosed_expression_abi_cxx11_(&local_50,this,select,true);
    to_enclosed_pointer_expression_abi_cxx11_(&local_70,this,true_value,true);
    to_enclosed_pointer_expression_abi_cxx11_(&local_90,this,false_value,true);
    join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[4],std::__cxx11::string>
              (&local_b0,(spirv_cross *)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31b050,
               (char (*) [4])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x311100,
               (char (*) [4])&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(true_value,false_value));
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    type_to_glsl_constructor_abi_cxx11_(&local_b0,this,restype);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    index = 0;
    while (index < restype->vecsize) {
      to_extract_component_expression_abi_cxx11_(&local_b0,this,select,index);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      to_extract_component_expression_abi_cxx11_(&local_b0,this,true_value,index);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      to_extract_component_expression_abi_cxx11_(&local_b0,this,false_value,index);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_b0);
      index = index + 1;
      if (index < restype->vecsize) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_ternary_expression(const SPIRType &restype, uint32_t select, uint32_t true_value,
                                           uint32_t false_value)
{
	string expr;
	auto &lerptype = expression_type(select);

	if (lerptype.vecsize == 1)
		expr = join(to_enclosed_expression(select), " ? ", to_enclosed_pointer_expression(true_value), " : ",
		            to_enclosed_pointer_expression(false_value));
	else
	{
		auto swiz = [this](uint32_t expression, uint32_t i) { return to_extract_component_expression(expression, i); };

		expr = type_to_glsl_constructor(restype);
		expr += "(";
		for (uint32_t i = 0; i < restype.vecsize; i++)
		{
			expr += swiz(select, i);
			expr += " ? ";
			expr += swiz(true_value, i);
			expr += " : ";
			expr += swiz(false_value, i);
			if (i + 1 < restype.vecsize)
				expr += ", ";
		}
		expr += ")";
	}

	return expr;
}